

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O2

void __thiscall CoreML::Specification::Imputer::set_replacestringvalue(Imputer *this,string *value)

{
  if (this->_oneof_case_[1] != 0xd) {
    clear_ReplaceValue(this);
    this->_oneof_case_[1] = 0xd;
    (this->ReplaceValue_).replacedoublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->ReplaceValue_).replacestringvalue_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  return;
}

Assistant:

inline void Imputer::set_replacestringvalue(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.Imputer.replaceStringValue)
  if (!has_replacestringvalue()) {
    clear_ReplaceValue();
    set_has_replacestringvalue();
    ReplaceValue_.replacestringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  ReplaceValue_.replacestringvalue_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.Imputer.replaceStringValue)
}